

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

void __thiscall rcg::Device::abortWaitingForModuleEvents(Device *this)

{
  element_type *peVar1;
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  if (in_RDI[3].super___mutex_base._M_mutex.__data.__list.__prev != (__pthread_internal_list *)0x0)
  {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1193bb);
    (*peVar1->EventKill)(in_RDI[3].super___mutex_base._M_mutex.__data.__list.__prev);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1193f4);
  return;
}

Assistant:

void Device::abortWaitingForModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (event != 0)
  {
    gentl->EventKill(event);
  }
}